

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-docstate.c
# Opt level: O1

fy_document_state * fy_document_state_alloc(void)

{
  fy_document_state *pfVar1;
  
  pfVar1 = (fy_document_state *)malloc(0x58);
  if (pfVar1 == (fy_document_state *)0x0) {
    pfVar1 = (fy_document_state *)0x0;
  }
  else {
    pfVar1->fyt_vd = (fy_token *)0x0;
    (pfVar1->fyt_td)._lh.next = (list_head *)0x0;
    pfVar1->refs = 0;
    (pfVar1->version).major = 0;
    *(undefined8 *)&(pfVar1->version).minor = 0;
    (pfVar1->end_mark).input_pos = 0;
    (pfVar1->end_mark).line = 0;
    (pfVar1->end_mark).column = 0;
    (pfVar1->start_mark).input_pos = 0;
    (pfVar1->start_mark).line = 0;
    (pfVar1->start_mark).column = 0;
    (pfVar1->node).next = (list_head *)0x0;
    (pfVar1->node).prev = (list_head *)0x0;
    (pfVar1->fyt_td)._lh.next = &(pfVar1->fyt_td)._lh;
    (pfVar1->fyt_td)._lh.prev = &(pfVar1->fyt_td)._lh;
    pfVar1->refs = 1;
  }
  return pfVar1;
}

Assistant:

struct fy_document_state *fy_document_state_alloc(void) {
    struct fy_document_state *fyds;

    fyds = malloc(sizeof(*fyds));
    if (!fyds)
        return NULL;
    memset(fyds, 0, sizeof(*fyds));

    fyds->fyt_vd = NULL;
    fy_token_list_init(&fyds->fyt_td);

    fyds->refs = 1;

    return fyds;
}